

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

void TTA::UpdateTable(uint u,uint v)

{
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  uint v_local;
  uint u_local;
  
  local_14 = v;
  if (u < v) {
    for (; local_14 != 0xffffffff; local_14 = next_[local_14]) {
      rtable_[local_14] = u;
    }
    next_[tail_[u]] = v;
    tail_[u] = tail_[v];
  }
  else {
    local_18 = u;
    if (v < u) {
      for (; local_18 != 0xffffffff; local_18 = next_[local_18]) {
        rtable_[local_18] = v;
      }
      next_[tail_[v]] = u;
      tail_[v] = tail_[u];
    }
  }
  return;
}

Assistant:

static void UpdateTable(unsigned u, unsigned v)
    {
        if (u < v) {
            unsigned i = v;
            while (i != UINT_MAX) {
                rtable_[i] = u;
                i = next_[i];
            }
            next_[tail_[u]] = v;
            tail_[u] = tail_[v];
        }
        else if (u > v) {
            unsigned i = u;
            while (i != UINT_MAX) {
                rtable_[i] = v;
                i = next_[i];
            }
            next_[tail_[v]] = u;
            tail_[v] = tail_[u];
        }
    }